

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table_impl.h
# Opt level: O3

int ht_init(hash_table_t *ht,size_t count)

{
  size_t sVar1;
  int iVar2;
  size_t __nmemb;
  void *pvVar3;
  
  sVar1 = 4;
  do {
    __nmemb = sVar1;
    sVar1 = __nmemb * 2;
  } while (__nmemb * 0xb3 >> 8 < count);
  pvVar3 = calloc(__nmemb,8);
  ht->table = pvVar3;
  if (pvVar3 == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    ht->offsets = (char *)0x0;
    ht->count = 0;
    ht->buckets = __nmemb;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int ht_init(hash_table_t *ht, size_t count)
{
    size_t buckets = 4;

    if ((HT_LOAD_FACTOR_FRAC) > 256 || (HT_LOAD_FACTOR_FRAC) < 1) {
        /*
         * 100% is bad but still the users choice.
         * 101% will never terminate insertion.
         */
        HT_PANIC("hash table failed with impossible load factor");
        return -1;
    }
    while (count > buckets * (HT_LOAD_FACTOR_FRAC) / 256) {
        buckets *= 2;
    }
    ht->table = calloc(buckets, sizeof(ht_item_t));
    if (ht->table == 0) {
        return -1;
    }
    ht->offsets = 0;
    ht->buckets = buckets;
    ht->count = 0;
    return 0;
}